

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O2

uint32_t __thiscall
event_track::DASHEventMessageBoxv1::parse
          (DASHEventMessageBoxv1 *this,char *ptr,uint data_size,uint64_t presentation_time)

{
  uint *puVar1;
  size_type sVar2;
  uint uVar3;
  ostream *poVar4;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  allocator local_51;
  string local_50 [32];
  
  uVar3 = 0;
  if (8 < data_size) {
    if (ptr[8] == '\x01') {
      poVar4 = std::operator<<((ostream *)&std::cout,"emsg v1");
      std::endl<char,std::char_traits<char>>(poVar4);
      fmp4_stream::full_box::parse(&this->super_full_box,ptr);
      uVar5 = fmp4_stream::full_box::size(&this->super_full_box);
      puVar1 = (uint *)(ptr + uVar5);
      uVar3 = *puVar1;
      *(uint *)&(this->super_full_box).field_0x6c =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar7 = *(ulong *)(puVar1 + 1);
      this->presentation_time_ =
           uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
           (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
           (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      uVar3 = puVar1[3];
      this->event_duration_ =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar3 = puVar1[4];
      this->id_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      std::__cxx11::string::string(local_50,(char *)(puVar1 + 5),&local_51);
      std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_50);
      std::__cxx11::string::~string(local_50);
      sVar2 = (this->scheme_id_uri_)._M_string_length;
      std::__cxx11::string::string(local_50,ptr + uVar5 + sVar2 + 0x15,&local_51);
      std::__cxx11::string::operator=((string *)&this->value_,local_50);
      std::__cxx11::string::~string(local_50);
      for (uVar7 = (ulong)((int)uVar5 + (int)sVar2 + (int)(this->value_)._M_string_length + 0x16);
          uVar3 = (this->super_full_box).super_box.size_, (uint)uVar7 < uVar3; uVar7 = uVar7 + 1) {
        local_50[0] = *(string *)(ptr + uVar7);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->message_data_,
                   (uchar *)local_50);
      }
    }
    else {
      fmp4_stream::full_box::parse(&this->super_full_box,ptr);
      uVar5 = fmp4_stream::full_box::size(&this->super_full_box);
      std::__cxx11::string::string(local_50,ptr + uVar5,&local_51);
      std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_50);
      std::__cxx11::string::~string(local_50);
      sVar2 = (this->scheme_id_uri_)._M_string_length;
      std::__cxx11::string::string(local_50,ptr + sVar2 + uVar5 + 1,&local_51);
      std::__cxx11::string::operator=((string *)&this->value_,local_50);
      std::__cxx11::string::~string(local_50);
      lVar6 = sVar2 + uVar5 + 1 + (this->value_)._M_string_length;
      uVar3 = *(uint *)(ptr + lVar6 + 1);
      *(uint *)&(this->super_full_box).field_0x6c =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar3 = *(uint *)(ptr + lVar6 + 5);
      this->presentation_time_ =
           (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) +
           presentation_time;
      uVar3 = *(uint *)(ptr + lVar6 + 9);
      this->event_duration_ =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar3 = *(uint *)(ptr + lVar6 + 0xd);
      this->id_ = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      for (uVar7 = (ulong)((int)lVar6 + 0x11); uVar3 = (this->super_full_box).super_box.size_,
          uVar7 < uVar3; uVar7 = uVar7 + 1) {
        local_50[0] = *(string *)(ptr + uVar7);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->message_data_,
                   (uchar *)local_50);
      }
    }
  }
  return uVar3;
}

Assistant:

uint32_t parse(const char *ptr, unsigned int data_size, uint64_t presentation_time = 0)
		{
			
			if (data_size > 8)
			{
				if ((uint8_t)*(ptr + 8) == 0x01) {
					std::cout << "emsg v1" << std::endl;

					fmp4_stream::full_box::parse(ptr);
					uint64_t offset = full_box::size();

					timescale_ = fmp4_read_uint32(ptr + offset);
					//cout << "timescale: " << timescale << endl;
					offset += 4;
					presentation_time_ = fmp4_read_uint64(ptr + offset);
					//cout << "presentation time: " << presentation_time << endl;
					offset += 8;
					event_duration_ = fmp4_read_uint32(ptr + offset);
					//cout << "event duration: " << event_duration << endl;
					offset += 4;
					id_ = fmp4_read_uint32(ptr + offset);
					offset += 4;
					//cout << "id: " << id << endl;
					scheme_id_uri_ = std::string(ptr + offset);
					offset = offset + scheme_id_uri_.size() + 1;
					//cout << "scheme_id_uri: " << scheme_id_uri << endl;
					value_ = std::string(ptr + offset);
					//cout << "value: " << value << endl;
					offset = offset + value_.size() + 1;

					for (unsigned int i = (unsigned int)offset; i < size_; i++)
						message_data_.push_back(*(ptr + (size_t)i));
				}
				else 
				{
					fmp4_stream::full_box::parse(ptr);
					uint64_t offset = full_box::size();
                    
					scheme_id_uri_ = std::string(ptr + offset);
					offset = offset + scheme_id_uri_.size() + 1;
					value_ = std::string(ptr + offset);
					offset = offset + value_.size() + 1;
					timescale_ = fmp4_read_uint32(ptr + offset);
					//cout << "timescale: " << timescale << endl;
					offset += 4;
					presentation_time_ = fmp4_read_uint32(ptr + offset) + presentation_time;
					//cout << "presentation time: " << presentation_time << endl;
					offset += 4;
					event_duration_ = fmp4_read_uint32(ptr + offset);
					//cout << "event duration: " << event_duration << endl;
					offset += 4;
					id_ = fmp4_read_uint32(ptr + offset);
					offset += 4;
					//cout << "id: " << id << endl;

					for (unsigned int i = (unsigned int)offset; i < size_; i++)
						message_data_.push_back(*(ptr + (size_t)i));
				}
				return size_;
			}
			return 0;
		}